

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_replacement_incr(int eci,uchar *src,zueci_u32 len)

{
  zueci_u32 local_18;
  zueci_u32 len_local;
  uchar *src_local;
  int eci_local;
  zueci_u32 local_4;
  
  if (len == 1) {
    local_4 = 1;
  }
  else if (((eci < 0x13) || (((0x14 < eci && (eci < 0x19)) || (eci == 0x1b)))) || (eci == 0xaa)) {
    local_4 = 1;
  }
  else if ((eci == 0x19) || (eci == 0x21)) {
    local_4 = 2;
  }
  else if ((eci == 0x22) || (eci == 0x23)) {
    local_18 = len;
    if (3 < len) {
      local_18 = 4;
    }
    local_4 = local_18;
  }
  else if (((((eci == 0x20) && (3 < len)) && (src[1] < 0x3a)) && ((0x2f < src[1] && (0x80 < *src))))
          && (*src < 0xe4)) {
    local_4 = 4;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int zueci_replacement_incr(const int eci, const unsigned char *src, const zueci_u32 len) {
    assert(len);
    assert(eci != 26 && eci != 899); /* Dealt with as special cases */
    if (len == 1) { /* Last char */
        return 1;
    }
    if (eci <= 18 || (eci >= 21 && eci <= 24) || eci == 27 || eci == 170) { /* Single-byte */
        return 1;
    }
    if (eci == 25 || eci == 33) { /* UTF-16BE/LE */
        return 2;
    }
    if (eci == 34 || eci == 35) { /* UTF-32BE/LE */
        return ZUECI_MIN(len, 4);
    }
    if (eci == 32) { /* GB 18030 */
        /* If have 4 bytes and match start range of 4-byter [81..E3][30..39] */
        if (len >= 4 && src[1] <= 0x39 && src[1] >= 0x30 && src[0] >= 0x81 && src[0] <= 0xE3) {
            /* Treat as 4-byter (without checking further) */
            return 4;
        }
        /* Else treat as 2-byter */
    }
    return 2;
}